

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
anon_unknown.dwarf_40def5::InlineImageTracker::convertIIDict
          (InlineImageTracker *this,QPDFObjectHandle *odict)

{
  bool bVar1;
  reference __in;
  type *ptVar2;
  BaseHandle *this_00;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  typed in_DL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar6;
  QPDFObjectHandle local_2b0;
  QPDFObjectHandle local_2a0;
  string local_290;
  undefined1 local_270 [8];
  string name_1;
  QPDFObjectHandle *iter;
  iterator __end4;
  iterator __begin4;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range4;
  undefined1 local_218 [8];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> filters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  QPDFObjectHandle local_1d0;
  allocator<char> local_1b9;
  string local_1b8 [32];
  undefined1 local_198 [8];
  QPDFObjectHandle colorspace;
  string name;
  QPDFObjectHandle value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  type *v;
  type *k;
  _Self local_120;
  iterator __end1;
  iterator __begin1;
  Dictionary *__range1;
  string local_f0;
  QPDFObjectHandle local_d0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  QPDFObjectHandle local_70 [2];
  allocator<char> local_49;
  string local_48;
  undefined1 local_21;
  QPDFObjectHandle *odict_local;
  InlineImageTracker *this_local;
  QPDFObjectHandle *dict;
  
  local_21 = 0;
  odict_local = odict;
  this_local = this;
  QPDFObjectHandle::newDictionary();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"/Type",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"/XObject",&local_91);
  QPDFObjectHandle::newName(local_70,&local_90);
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_48,local_70);
  QPDFObjectHandle::~QPDFObjectHandle(local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"/Subtype",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"/Image",(allocator<char> *)((long)&__range1 + 7));
  QPDFObjectHandle::newName(&local_d0,&local_f0);
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_b8,&local_d0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__begin1,in_DL);
  __end1 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin1);
  local_120._M_node = (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin1)
  ;
  while (bVar1 = std::operator!=(&__end1,&local_120), bVar1) {
    __in = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
           ::operator*(&__end1);
    ptVar2 = std::get<0ul,std::__cxx11::string_const,QPDFObjectHandle>(__in);
    this_00 = &std::get<1ul,std::__cxx11::string_const,QPDFObjectHandle>(__in)->super_BaseHandle;
    bVar1 = ::qpdf::BaseHandle::null(this_00);
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)
                 &value.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (string *)ptVar2);
      QPDFObjectHandle::QPDFObjectHandle
                ((QPDFObjectHandle *)((long)&name.field_2 + 8),(QPDFObjectHandle *)this_00);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &value.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,"/BPC");
      if (bVar1) {
        std::__cxx11::string::operator=
                  ((string *)
                   &value.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   "/BitsPerComponent");
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&value.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,"/CS");
        if (bVar1) {
          std::__cxx11::string::operator=
                    ((string *)
                     &value.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     "/ColorSpace");
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&value.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount,"/D");
          if (bVar1) {
            std::__cxx11::string::operator=
                      ((string *)
                       &value.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       "/Decode");
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&value.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount,"/DP");
            if (bVar1) {
              std::__cxx11::string::operator=
                        ((string *)
                         &value.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                         "/DecodeParms");
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&value.super_BaseHandle.obj.
                                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,"/F");
              if (bVar1) {
                std::__cxx11::string::operator=
                          ((string *)
                           &value.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                           "/Filter");
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&value.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount,"/H");
                if (bVar1) {
                  std::__cxx11::string::operator=
                            ((string *)
                             &value.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ,"/Height");
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&value.super_BaseHandle.obj.
                                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount,"/IM");
                  if (bVar1) {
                    std::__cxx11::string::operator=
                              ((string *)
                               &value.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,"/ImageMask");
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&value.super_BaseHandle.obj.
                                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount,"/I");
                    if (bVar1) {
                      std::__cxx11::string::operator=
                                ((string *)
                                 &value.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,"/Interpolate");
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&value.super_BaseHandle.obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount,"/W");
                      if (bVar1) {
                        std::__cxx11::string::operator=
                                  ((string *)
                                   &value.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount,"/Width");
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &value.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,"/ColorSpace");
      if (bVar1) {
        bVar1 = QPDFObjectHandle::isName((QPDFObjectHandle *)((long)&name.field_2 + 8));
        if (bVar1) {
          QPDFObjectHandle::getName_abi_cxx11_
                    ((string *)
                     &colorspace.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (QPDFObjectHandle *)((long)&name.field_2 + 8));
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&colorspace.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount,"/G");
          if (bVar1) {
            std::__cxx11::string::operator=
                      ((string *)
                       &colorspace.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       "/DeviceGray");
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&colorspace.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount,"/RGB");
            if (bVar1) {
              std::__cxx11::string::operator=
                        ((string *)
                         &colorspace.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                         "/DeviceRGB");
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&colorspace.super_BaseHandle.obj.
                                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,"/CMYK");
              if (bVar1) {
                std::__cxx11::string::operator=
                          ((string *)
                           &colorspace.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                           "/DeviceCMYK");
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&colorspace.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount,"/I");
                if (bVar1) {
                  std::__cxx11::string::operator=
                            ((string *)
                             &colorspace.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ,"/Indexed");
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_1b8,"/ColorSpace",&local_1b9);
                  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_198,(string *)(odict + 2));
                  std::__cxx11::string::~string(local_1b8);
                  std::allocator<char>::~allocator(&local_1b9);
                  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_198);
                  if ((bVar1) &&
                     (bVar1 = QPDFObjectHandle::hasKey
                                        ((QPDFObjectHandle *)local_198,
                                         (string *)
                                         &colorspace.super_BaseHandle.obj.
                                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount), bVar1)) {
                    QTC::TC("qpdf","QPDFPageObjectHelper colorspace lookup",0);
                    QPDFObjectHandle::getKey(&local_1d0,(string *)local_198);
                    QPDFObjectHandle::operator=
                              ((QPDFObjectHandle *)((long)&name.field_2 + 8),&local_1d0);
                    QPDFObjectHandle::~QPDFObjectHandle(&local_1d0);
                  }
                  else {
                    std::operator+(&local_1f0,"unable to resolve colorspace ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&colorspace.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
                    QPDFObjectHandle::warnIfPossible(odict + 2,&local_1f0);
                    std::__cxx11::string::~string((string *)&local_1f0);
                  }
                  std::__cxx11::string::clear();
                  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_198);
                }
              }
            }
          }
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            QPDFObjectHandle::newName
                      ((QPDFObjectHandle *)
                       &filters.
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (string *)
                       &colorspace.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            QPDFObjectHandle::operator=
                      ((QPDFObjectHandle *)((long)&name.field_2 + 8),
                       (QPDFObjectHandle *)
                       &filters.
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            QPDFObjectHandle::~QPDFObjectHandle
                      ((QPDFObjectHandle *)
                       &filters.
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          std::__cxx11::string::~string
                    ((string *)
                     &colorspace.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&value.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,"/Filter");
        if (bVar1) {
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_218);
          bVar1 = QPDFObjectHandle::isName((QPDFObjectHandle *)((long)&name.field_2 + 8));
          if (bVar1) {
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                      ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_218,
                       (value_type *)((long)&name.field_2 + 8));
          }
          else {
            bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)((long)&name.field_2 + 8));
            if (bVar1) {
              QPDFObjectHandle::getArrayAsVector
                        ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range4,
                         (QPDFObjectHandle *)((long)&name.field_2 + 8));
              std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=
                        ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_218,
                         (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range4);
              std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                        ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range4);
            }
          }
          __end4 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                             ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                              local_218);
          iter = (QPDFObjectHandle *)
                 std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                           ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_218
                           );
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                             *)&iter), bVar1) {
            name_1.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                 ::operator*(&__end4);
            std::__cxx11::string::string((string *)local_270);
            bVar1 = QPDFObjectHandle::isName((QPDFObjectHandle *)name_1.field_2._8_8_);
            if (bVar1) {
              QPDFObjectHandle::getName_abi_cxx11_
                        (&local_290,(QPDFObjectHandle *)name_1.field_2._8_8_);
              std::__cxx11::string::operator=((string *)local_270,(string *)&local_290);
              std::__cxx11::string::~string((string *)&local_290);
            }
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_270,"/AHx");
            if (bVar1) {
              std::__cxx11::string::operator=((string *)local_270,"/ASCIIHexDecode");
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_270,"/A85");
              if (bVar1) {
                std::__cxx11::string::operator=((string *)local_270,"/ASCII85Decode");
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_270,"/LZW");
                if (bVar1) {
                  std::__cxx11::string::operator=((string *)local_270,"/LZWDecode");
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_270,"/Fl");
                  if (bVar1) {
                    std::__cxx11::string::operator=((string *)local_270,"/FlateDecode");
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_270,"/RL");
                    if (bVar1) {
                      std::__cxx11::string::operator=((string *)local_270,"/RunLengthDecode");
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_270,"/CCF");
                      if (bVar1) {
                        std::__cxx11::string::operator=((string *)local_270,"/CCITTFaxDecode");
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_270,"/DCT");
                        if (bVar1) {
                          std::__cxx11::string::operator=((string *)local_270,"/DCTDecode");
                        }
                        else {
                          std::__cxx11::string::clear();
                        }
                      }
                    }
                  }
                }
              }
            }
            uVar3 = std::__cxx11::string::empty();
            if ((uVar3 & 1) == 0) {
              QPDFObjectHandle::newName(&local_2a0,(string *)local_270);
              QPDFObjectHandle::operator=((QPDFObjectHandle *)name_1.field_2._8_8_,&local_2a0);
              QPDFObjectHandle::~QPDFObjectHandle(&local_2a0);
            }
            std::__cxx11::string::~string((string *)local_270);
            __gnu_cxx::
            __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
            ::operator++(&__end4);
          }
          bVar1 = QPDFObjectHandle::isName((QPDFObjectHandle *)((long)&name.field_2 + 8));
          if ((bVar1) &&
             (sVar4 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                                 local_218), sVar4 == 1)) {
            pvVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                               ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                                local_218,0);
            QPDFObjectHandle::operator=((QPDFObjectHandle *)((long)&name.field_2 + 8),pvVar5);
          }
          else {
            bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)((long)&name.field_2 + 8));
            if (bVar1) {
              QPDFObjectHandle::newArray
                        (&local_2b0,
                         (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_218);
              QPDFObjectHandle::operator=((QPDFObjectHandle *)((long)&name.field_2 + 8),&local_2b0);
              QPDFObjectHandle::~QPDFObjectHandle(&local_2b0);
            }
          }
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_218);
        }
      }
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)this,
                 (string *)
                 &value.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (QPDFObjectHandle *)((long)&name.field_2 + 8));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)((long)&name.field_2 + 8));
      std::__cxx11::string::~string
                ((string *)
                 &value.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
    ::operator++(&__end1);
  }
  ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin1);
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
InlineImageTracker::convertIIDict(QPDFObjectHandle odict)
{
    QPDFObjectHandle dict = QPDFObjectHandle::newDictionary();
    dict.replaceKey("/Type", QPDFObjectHandle::newName("/XObject"));
    dict.replaceKey("/Subtype", QPDFObjectHandle::newName("/Image"));
    for (auto const& [k, v]: odict.as_dictionary()) {
        if (v.null()) {
            continue;
        }
        auto key = k;
        auto value = v;
        if (key == "/BPC") {
            key = "/BitsPerComponent";
        } else if (key == "/CS") {
            key = "/ColorSpace";
        } else if (key == "/D") {
            key = "/Decode";
        } else if (key == "/DP") {
            key = "/DecodeParms";
        } else if (key == "/F") {
            key = "/Filter";
        } else if (key == "/H") {
            key = "/Height";
        } else if (key == "/IM") {
            key = "/ImageMask";
        } else if (key == "/I") {
            key = "/Interpolate";
        } else if (key == "/W") {
            key = "/Width";
        }

        if (key == "/ColorSpace") {
            if (value.isName()) {
                std::string name = value.getName();
                if (name == "/G") {
                    name = "/DeviceGray";
                } else if (name == "/RGB") {
                    name = "/DeviceRGB";
                } else if (name == "/CMYK") {
                    name = "/DeviceCMYK";
                } else if (name == "/I") {
                    name = "/Indexed";
                } else {
                    // This is a key in the page's /Resources -> /ColorSpace dictionary. We need to
                    // look it up and use its value as the color space for the image.
                    QPDFObjectHandle colorspace = resources.getKey("/ColorSpace");
                    if (colorspace.isDictionary() && colorspace.hasKey(name)) {
                        QTC::TC("qpdf", "QPDFPageObjectHelper colorspace lookup");
                        value = colorspace.getKey(name);
                    } else {
                        resources.warnIfPossible("unable to resolve colorspace " + name);
                    }
                    name.clear();
                }
                if (!name.empty()) {
                    value = QPDFObjectHandle::newName(name);
                }
            }
        } else if (key == "/Filter") {
            std::vector<QPDFObjectHandle> filters;
            if (value.isName()) {
                filters.push_back(value);
            } else if (value.isArray()) {
                filters = value.getArrayAsVector();
            }
            for (auto& iter: filters) {
                std::string name;
                if (iter.isName()) {
                    name = iter.getName();
                }
                if (name == "/AHx") {
                    name = "/ASCIIHexDecode";
                } else if (name == "/A85") {
                    name = "/ASCII85Decode";
                } else if (name == "/LZW") {
                    name = "/LZWDecode";
                } else if (name == "/Fl") {
                    name = "/FlateDecode";
                } else if (name == "/RL") {
                    name = "/RunLengthDecode";
                } else if (name == "/CCF") {
                    name = "/CCITTFaxDecode";
                } else if (name == "/DCT") {
                    name = "/DCTDecode";
                } else {
                    name.clear();
                }
                if (!name.empty()) {
                    iter = QPDFObjectHandle::newName(name);
                }
            }
            if (value.isName() && (filters.size() == 1)) {
                value = filters.at(0);
            } else if (value.isArray()) {
                value = QPDFObjectHandle::newArray(filters);
            }
        }
        dict.replaceKey(key, value);
    }
    return dict;
}